

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mesh_edgebreaker_encoder_impl.cc
# Opt level: O2

int __thiscall
draco::MeshEdgebreakerEncoderImpl<draco::MeshEdgebreakerTraversalEncoder>::EncodeHole
          (MeshEdgebreakerEncoderImpl<draco::MeshEdgebreakerTraversalEncoder> *this,
          CornerIndex start_corner_id,bool encode_first_vertex)

{
  int iVar1;
  CornerTable *pCVar2;
  uint uVar3;
  size_type __n;
  int iVar4;
  uint uVar5;
  uint uVar6;
  ulong uVar7;
  ulong uVar8;
  reference rVar9;
  
  if (start_corner_id.value_ == 0xffffffff) {
    uVar7 = 0xffffffffffffffff;
  }
  else if (start_corner_id.value_ % 3 == 0) {
    uVar7 = (ulong)(start_corner_id.value_ + 2);
  }
  else {
    uVar7 = (ulong)(start_corner_id.value_ - 1);
  }
  pCVar2 = (this->corner_table_)._M_t.
           super___uniq_ptr_impl<draco::CornerTable,_std::default_delete<draco::CornerTable>_>._M_t.
           super__Tuple_impl<0UL,_draco::CornerTable_*,_std::default_delete<draco::CornerTable>_>.
           super__Head_base<0UL,_draco::CornerTable_*,_false>._M_head_impl;
  while ((iVar4 = (int)uVar7, iVar4 != -1 &&
         (iVar1 = *(int *)(*(long *)&(pCVar2->opposite_corners_).vector_.
                                     super__Vector_base<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>_>_>
                          + (uVar7 & 0xffffffff) * 4), iVar1 != -1))) {
    uVar7 = (ulong)(iVar1 + 1U);
    if ((iVar1 + 1U) % 3 == 0) {
      uVar7 = (ulong)(iVar1 - 2);
    }
  }
  if (start_corner_id.value_ == 0xffffffff) {
    uVar3 = 0xffffffff;
  }
  else {
    uVar3 = *(uint *)(*(long *)&(pCVar2->corner_to_vertex_map_).vector_ +
                     (ulong)start_corner_id.value_ * 4);
  }
  if (encode_first_vertex) {
    rVar9 = std::vector<bool,_std::allocator<bool>_>::operator[]
                      (&this->visited_vertex_ids_,(ulong)uVar3);
    *rVar9._M_p = *rVar9._M_p | rVar9._M_mask;
  }
  uVar6 = (uint)encode_first_vertex;
  rVar9 = std::vector<bool,_std::allocator<bool>_>::operator[]
                    (&this->visited_holes_,
                     (long)(this->vertex_hole_id_).super__Vector_base<int,_std::allocator<int>_>.
                           _M_impl.super__Vector_impl_data._M_start[uVar3]);
  *rVar9._M_p = *rVar9._M_p | rVar9._M_mask;
  __n = 0xffffffff;
  if (iVar4 != -1) {
    if ((int)((uVar7 & 0xffffffff) % 3) == 0) {
      uVar5 = iVar4 + 2;
      __n = 0xffffffff;
      if (uVar5 == 0xffffffff) goto LAB_0013364a;
    }
    else {
      uVar5 = iVar4 - 1;
    }
    __n = (size_type)
          *(uint *)(*(long *)&(((this->corner_table_)._M_t.
                                super___uniq_ptr_impl<draco::CornerTable,_std::default_delete<draco::CornerTable>_>
                                ._M_t.
                                super__Tuple_impl<0UL,_draco::CornerTable_*,_std::default_delete<draco::CornerTable>_>
                                .super__Head_base<0UL,_draco::CornerTable_*,_false>._M_head_impl)->
                              corner_to_vertex_map_).vector_ + (ulong)uVar5 * 4);
  }
LAB_0013364a:
LAB_00133651:
  do {
    if ((uint)__n == uVar3) {
      return uVar6;
    }
    rVar9 = std::vector<bool,_std::allocator<bool>_>::operator[](&this->visited_vertex_ids_,__n);
    *rVar9._M_p = *rVar9._M_p | rVar9._M_mask;
    uVar8 = 0xffffffff;
    iVar4 = (int)uVar7;
    if (iVar4 != -1) {
      uVar5 = iVar4 - 2;
      if ((iVar4 + 1U) % 3 != 0) {
        uVar5 = iVar4 + 1U;
      }
      uVar8 = (ulong)uVar5;
    }
    uVar6 = uVar6 + 1;
    pCVar2 = (this->corner_table_)._M_t.
             super___uniq_ptr_impl<draco::CornerTable,_std::default_delete<draco::CornerTable>_>.
             _M_t.
             super__Tuple_impl<0UL,_draco::CornerTable_*,_std::default_delete<draco::CornerTable>_>.
             super__Head_base<0UL,_draco::CornerTable_*,_false>._M_head_impl;
    while (iVar4 = (int)uVar8, iVar4 != -1) {
      iVar1 = *(int *)(*(long *)&(pCVar2->opposite_corners_).vector_.
                                 super__Vector_base<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>_>_>
                      + uVar8 * 4);
      if (iVar1 == -1) {
        if ((int)(uVar8 % 3) == 0) {
          uVar5 = iVar4 + 2;
          __n = 0xffffffff;
          uVar7 = 0xfffffffd;
          if (uVar5 == 0xffffffff) goto LAB_00133651;
        }
        else {
          uVar5 = iVar4 - 1;
        }
        __n = (size_type)
              *(uint *)(*(long *)&(pCVar2->corner_to_vertex_map_).vector_ + (ulong)uVar5 * 4);
        uVar7 = uVar8;
        goto LAB_00133651;
      }
      uVar8 = (ulong)(iVar1 + 1U);
      if ((iVar1 + 1U) % 3 == 0) {
        uVar8 = (ulong)(iVar1 - 2);
      }
    }
    __n = 0xffffffff;
    uVar7 = 0xffffffff;
  } while( true );
}

Assistant:

int MeshEdgebreakerEncoderImpl<TraversalEncoder>::EncodeHole(
    CornerIndex start_corner_id, bool encode_first_vertex) {
  // We know that the start corner lies on a hole but we first need to find the
  // boundary edge going from that vertex. It is the first edge in CW
  // direction.
  CornerIndex corner_id = start_corner_id;
  corner_id = corner_table_->Previous(corner_id);
  while (corner_table_->Opposite(corner_id) != kInvalidCornerIndex) {
    corner_id = corner_table_->Opposite(corner_id);
    corner_id = corner_table_->Next(corner_id);
  }
  const VertexIndex start_vertex_id = corner_table_->Vertex(start_corner_id);

  int num_encoded_hole_verts = 0;
  if (encode_first_vertex) {
    visited_vertex_ids_[start_vertex_id.value()] = true;
    ++num_encoded_hole_verts;
  }

  // corner_id is now opposite to the boundary edge.
  // Mark the hole as visited.
  visited_holes_[vertex_hole_id_[start_vertex_id.value()]] = true;
  // Get the start vertex of the edge and use it as a reference.
  VertexIndex start_vert_id =
      corner_table_->Vertex(corner_table_->Next(corner_id));
  // Get the end vertex of the edge.
  VertexIndex act_vertex_id =
      corner_table_->Vertex(corner_table_->Previous(corner_id));
  while (act_vertex_id != start_vertex_id) {
    // Encode the end vertex of the boundary edge.

    start_vert_id = act_vertex_id;

    // Mark the vertex as visited.
    visited_vertex_ids_[act_vertex_id.value()] = true;
    ++num_encoded_hole_verts;
    corner_id = corner_table_->Next(corner_id);
    // Look for the next attached open boundary edge.
    while (corner_table_->Opposite(corner_id) != kInvalidCornerIndex) {
      corner_id = corner_table_->Opposite(corner_id);
      corner_id = corner_table_->Next(corner_id);
    }
    act_vertex_id = corner_table_->Vertex(corner_table_->Previous(corner_id));
  }
  return num_encoded_hole_verts;
}